

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O2

Error __thiscall
miniros::master::ParameterStorage::setParam
          (ParameterStorage *this,string *caller_id,string *key,RpcValue *value)

{
  Level level;
  void *logger_handle;
  bool bVar1;
  Error EVar2;
  ostream *poVar3;
  XmlRpcValue *this_00;
  RpcValue *__n;
  void *__buf;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar4;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string fullKey;
  Path name;
  stringstream ss;
  ostream local_1a8 [376];
  
  __n = value;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = ::std::operator<<(local_1a8,(string *)key);
  ::std::operator<<(poVar3,"=");
  XmlRpc::XmlRpcValue::write(value,(int)local_1a8,__buf,(size_t)__n);
  poVar3 = ::std::operator<<(local_1a8," from ");
  ::std::operator<<(poVar3,(string *)caller_id);
  names::resolve(&fullKey,caller_id,key,false);
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (setParam::loc.initialized_ == false) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"miniros.unknown_package",&local_269);
    ::std::operator+(&local_248,&local_268,".");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     &local_248,"rosparam");
    console::initializeLogLocation(&setParam::loc,(string *)&name,Info);
    ::std::__cxx11::string::~string((string *)&name);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string((string *)&local_268);
  }
  if (setParam::loc.level_ != Info) {
    console::setLogLocationLevel(&setParam::loc,Info);
    console::checkLogLocationEnabled(&setParam::loc);
  }
  if (setParam::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,setParam::loc.logger_,setParam::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x97,
                   "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                   ,"setParam(\"%s\") from \"%s\", key=\"%s\"",fullKey._M_dataplus._M_p,
                   (caller_id->_M_dataplus)._M_p,(key->_M_dataplus)._M_p);
  }
  ::std::mutex::lock(&this->m_parameterLock);
  bVar1 = ::std::operator==(&fullKey,"/");
  if (bVar1) {
    if (value->_type != TypeStruct) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.initialized_ == false) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"miniros.unknown_package",&local_269);
        ::std::operator+(&local_248,&local_268,".");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                         &local_248,"rosparam");
        console::initializeLogLocation
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc,(string *)&name,Error);
        ::std::__cxx11::string::~string((string *)&name);
        ::std::__cxx11::string::~string((string *)&local_248);
        ::std::__cxx11::string::~string((string *)&local_268);
      }
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.level_ != Error) {
        console::setLogLocationLevel
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc,Error);
        console::checkLogLocationEnabled
                  (&setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
                    ::loc);
      }
      logger_handle =
           setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
           ::loc.logger_;
      level = setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
              ::loc.level_;
      EVar2.code = InvalidValue;
      if (setParam(std::__cxx11::string_const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&)
          ::loc.logger_enabled_ == true) {
        ::std::__cxx11::stringbuf::str();
        console::print((FilterBase *)0x0,logger_handle,level,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                       ,0x9f,
                       "Error miniros::master::ParameterStorage::setParam(const std::string &, const std::string &, const RpcValue &)"
                       ,"setParam(\"%s\") - cannot set root of parameter tree to non-dictionary",
                       name.m_lastName._M_len);
        ::std::__cxx11::string::~string((string *)&name);
      }
      goto LAB_0027ed85;
    }
    XmlRpc::XmlRpcValue::operator=(&this->m_parameterRoot,value);
    checkParamUpdates(this,&fullKey,&this->m_parameterRoot);
  }
  else {
    names::Path::Path(&name);
    EVar2 = names::Path::fromString(&name,&fullKey);
    if (EVar2.code != Ok) {
      names::Path::~Path(&name);
      goto LAB_0027ed85;
    }
    pVar4 = findParameter(this,&name,true);
    this_00 = pVar4.first;
    if (this_00 == (XmlRpcValue *)0x0) {
      EVar2.code = ParameterNotFound;
    }
    else {
      XmlRpc::XmlRpcValue::operator=(this_00,value);
      EVar2.code = Ok;
      checkParamUpdates(this,&fullKey,this_00);
    }
    names::Path::~Path(&name);
    if (this_00 == (XmlRpcValue *)0x0) goto LAB_0027ed85;
  }
  EVar2.code = Ok;
LAB_0027ed85:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
  ::std::__cxx11::string::~string((string *)&fullKey);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return (Error)EVar2.code;
}

Assistant:

Error ParameterStorage::setParam(const std::string& caller_id, const std::string& key, const RpcValue& value)
{
  std::stringstream ss;
  ss << key << "=";
  value.write(ss);
  ss << " from " << caller_id;

  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  MINIROS_INFO_NAMED("rosparam", "setParam(\"%s\") from \"%s\", key=\"%s\"", fullKey.c_str(), caller_id.c_str(), key.c_str());
  std::scoped_lock<std::mutex> m_lock(m_parameterLock);

  if (fullKey == "/") {
    if (value.getType() == RpcValue::TypeStruct) {
      m_parameterRoot = value;
      checkParamUpdates(fullKey, &m_parameterRoot);
    } else {
      MINIROS_ERROR_NAMED("rosparam", "setParam(\"%s\") - cannot set root of parameter tree to non-dictionary", ss.str().c_str());
      return Error::InvalidValue;
    }
  } else {
    names::Path name;
    if (auto err = name.fromString(fullKey); !err)
      return err;
    RpcValue* param = findParameter(name, true).first;
    if (!param)
      return Error::ParameterNotFound;
    *param = value;
    checkParamUpdates(fullKey, param);
  }

  return Error::Ok;
}